

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O3

list MSD1(list a,int n)

{
  long lVar1;
  byte bVar2;
  int pos;
  list plVar3;
  stack *psVar4;
  stack *psVar5;
  list plVar6;
  list plVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  list plVar11;
  stack *temp;
  ulong uVar12;
  bucket_conflict1 *b;
  list local_38;
  
  if (1 < n) {
    initmem(stackmem,0x18,(uint)n / 0x32);
    psVar4 = (stack *)allocmem(stackmem,0x18);
    stackp = psVar4;
    psVar4->head = a;
    psVar4->tail = (list)0x0;
    psVar4->size = n;
    psVar4->pos = 0;
    local_38 = (list)0x0;
    do {
      while (psVar5 = (stack *)deallocmem(stackmem,0x18), stackp = psVar5, psVar4->size != 0) {
        plVar7 = psVar4->head;
        pos = psVar4->pos;
        uVar9 = (uint)plVar7->str[pos];
        plVar11 = plVar7;
        if (plVar7->next == (list)0x0) {
          iVar8 = 1;
          uVar12 = 0;
          uVar10 = 0xff;
        }
        else {
          uVar10 = 0xff;
          uVar12 = 0;
          iVar8 = 1;
          plVar6 = plVar7;
          plVar3 = plVar7->next;
          do {
            plVar7 = plVar3;
            bVar2 = plVar7->str[pos];
            if (uVar9 == bVar2) {
              iVar8 = iVar8 + 1;
            }
            else {
              lVar1 = (ulong)uVar9 * 0x18;
              if ((&bucketing_b)[(ulong)uVar9 * 3] == 0) {
                (&bucketing_b)[(ulong)uVar9 * 3] = (long)plVar11;
                *(list *)(&DAT_00c9bc38 + lVar1) = plVar6;
                *(int *)(&DAT_00c9bc40 + lVar1) = iVar8;
                if (uVar9 != 0) {
                  if (uVar9 <= uVar10) {
                    uVar10 = uVar9;
                  }
                  if ((uint)uVar12 <= uVar9) {
                    uVar12 = (ulong)uVar9;
                  }
                }
              }
              else {
                *(list *)(*(long *)(&DAT_00c9bc38 + lVar1) + 8) = plVar11;
                *(list *)(&DAT_00c9bc38 + lVar1) = plVar6;
                *(int *)(&DAT_00c9bc40 + lVar1) = *(int *)(&DAT_00c9bc40 + lVar1) + iVar8;
              }
              iVar8 = 1;
              plVar11 = plVar7;
              uVar9 = (uint)bVar2;
            }
            plVar6 = plVar7;
            plVar3 = plVar7->next;
          } while (plVar7->next != (list)0x0);
        }
        lVar1 = (ulong)uVar9 * 0x18;
        if ((&bucketing_b)[(ulong)uVar9 * 3] == 0) {
          (&bucketing_b)[(ulong)uVar9 * 3] = (long)plVar11;
          *(list *)(&DAT_00c9bc38 + lVar1) = plVar7;
          *(int *)(&DAT_00c9bc40 + lVar1) = iVar8;
          if (uVar9 != 0) {
            if (uVar9 <= uVar10) {
              uVar10 = uVar9;
            }
            if ((uint)uVar12 <= uVar9) {
              uVar12 = (ulong)uVar9;
            }
          }
        }
        else {
          *(list *)(*(long *)(&DAT_00c9bc38 + lVar1) + 8) = plVar11;
          *(list *)(&DAT_00c9bc38 + lVar1) = plVar7;
          *(int *)(&DAT_00c9bc40 + lVar1) = *(int *)(&DAT_00c9bc40 + lVar1) + iVar8;
        }
        if (bucketing_b != 0) {
          _DAT_00c9bc40 = 0;
          ontostack((bucket_conflict1 *)&bucketing_b,pos);
        }
        if (uVar10 <= (uint)uVar12) {
          b = (bucket_conflict1 *)(&bucketing_b + (ulong)uVar10 * 3);
          do {
            if (b->head != (list)0x0) {
              ontostack(b,pos + 1);
            }
            b = b + 1;
          } while (b <= (bucket_conflict1 *)(&bucketing_b + uVar12 * 3));
        }
        psVar4 = stackp;
        if (stackp == (stack *)0x0) goto LAB_00250d86;
      }
      psVar4->tail->next = local_38;
      local_38 = psVar4->head;
      psVar4 = psVar5;
    } while (psVar5 != (stack *)0x0);
LAB_00250d86:
    freemem(stackmem);
    a = local_38;
  }
  return a;
}

Assistant:

list MSD1(list a, int n)
{
   list res = NULL;
   stack *s;

   if (n < 2) return a;
   initmem(stackmem, sizeof(struct stackrec), n/50);
   push(a, NULL, n, 0);

   while (!stackempty()) {
      s = pop();
      if (!s->size) {   /* sorted */
         s->tail->next = res;
         res = s->head;
         continue;
      }
      bucketing(s->head, s->pos);
   }

   freemem(stackmem);
   return res;
}